

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O3

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Point *a,S2Point *b)

{
  bool bVar1;
  int iVar2;
  S2Point *pSVar3;
  int i;
  long lVar4;
  S1ChordAngle SVar5;
  S1ChordAngle SVar6;
  S1ChordAngle min_dist;
  S2EdgeCrosser crosser;
  S2Point v [4];
  S1ChordAngle local_120;
  double local_118;
  ostream *local_110;
  S2EdgeCrosser local_108;
  S2Point local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  S2Point SStack_50;
  
  SVar5 = GetDistanceInternal(this,a,true);
  SVar6 = GetDistanceInternal(this,b,true);
  if (SVar5.length2_ <= SVar6.length2_) {
    SVar6 = SVar5;
  }
  local_120.length2_ = SVar6.length2_;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_108,0.0);
  if ((SVar6.length2_ != (double)local_108.a_) || (NAN(SVar6.length2_) || NAN((double)local_108.a_))
     ) {
    pSVar3 = &local_98;
    SStack_50.c_[1] = 0.0;
    SStack_50.c_[2] = 0.0;
    local_58 = 0;
    SStack_50.c_[0] = 0.0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_98.c_[2] = 0.0;
    uStack_80 = 0;
    local_98.c_[0] = 0.0;
    local_98.c_[1] = 0.0;
    lVar4 = 0;
    do {
      GetVertex((S2Point *)&local_108,this,(int)lVar4);
      pSVar3->c_[2] = local_108.a_cross_b_.c_[0];
      pSVar3->c_[0] = (VType)local_108.a_;
      pSVar3->c_[1] = (VType)local_108.b_;
      lVar4 = lVar4 + 1;
      pSVar3 = pSVar3 + 1;
    } while (lVar4 != 4);
    S2EdgeCrosser::S2EdgeCrosser(&local_108,a,b,&SStack_50);
    lVar4 = 0;
    do {
      pSVar3 = (S2Point *)((long)local_98.c_ + lVar4);
      bVar1 = S2::IsUnitLength(pSVar3);
      if (!bVar1) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                   ,0x108,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_110,"Check failed: S2::IsUnitLength(*d) ",0x23);
        abort();
      }
      iVar2 = s2pred::TriageSign(local_108.a_,local_108.b_,pSVar3,&local_108.a_cross_b_);
      if (((iVar2 == 0) || (local_108.acb_ != -iVar2)) &&
         (local_108.bda_ = iVar2, iVar2 = S2EdgeCrosser::CrossingSignInternal(&local_108,pSVar3),
         pSVar3 = local_108.c_, -1 < iVar2)) {
        S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_118,0.0);
        return (S1ChordAngle)local_118;
      }
      local_108.c_ = pSVar3;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x60);
    lVar4 = 0;
    do {
      S2::UpdateMinDistance((S2Point *)((long)local_98.c_ + lVar4),a,b,&local_120);
      lVar4 = lVar4 + 0x18;
      SVar6.length2_ = local_120.length2_;
    } while (lVar4 != 0x60);
  }
  return (S1ChordAngle)SVar6.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Point& a, const S2Point& b) const {
  // Possible optimizations:
  //  - Currently the (cell vertex, edge endpoint) distances are computed
  //    twice each, and the length of AB is computed 4 times.
  //  - To fix this, refactor GetDistance(target) so that it skips calculating
  //    the distance to each cell vertex.  Instead, compute the cell vertices
  //    and distances in this function, and add a low-level UpdateMinDistance
  //    that allows the XA, XB, and AB distances to be passed in.
  //  - It might also be more efficient to do all calculations in UVW-space,
  //    since this would involve transforming 2 points rather than 4.

  // First, check the minimum distance to the edge endpoints A and B.
  // (This also detects whether either endpoint is inside the cell.)
  S1ChordAngle min_dist = min(GetDistance(a), GetDistance(b));
  if (min_dist == S1ChordAngle::Zero()) return min_dist;

  // Otherwise, check whether the edge crosses the cell boundary.
  // Note that S2EdgeCrosser needs pointers to vertices.
  S2Point v[4];
  for (int i = 0; i < 4; ++i) {
    v[i] = GetVertex(i);
  }
  S2EdgeCrosser crosser(&a, &b, &v[3]);
  for (int i = 0; i < 4; ++i) {
    if (crosser.CrossingSign(&v[i]) >= 0) {
      return S1ChordAngle::Zero();
    }
  }
  // Finally, check whether the minimum distance occurs between a cell vertex
  // and the interior of the edge AB.  (Some of this work is redundant, since
  // it also checks the distance to the endpoints A and B again.)
  //
  // Note that we don't need to check the distance from the interior of AB to
  // the interior of a cell edge, because the only way that this distance can
  // be minimal is if the two edges cross (already checked above).
  for (int i = 0; i < 4; ++i) {
    S2::UpdateMinDistance(v[i], a, b, &min_dist);
  }
  return min_dist;
}